

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::UniformLocationTests::init(UniformLocationTests *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppSVar1;
  int *piVar2;
  undefined4 uVar3;
  RenderContext *pRVar4;
  Context *pCVar5;
  ulong uVar6;
  undefined8 uVar7;
  UniformLocationTests *pUVar8;
  uint uVar9;
  deUint32 dVar10;
  int iVar11;
  ShaderStage SVar12;
  ShaderStage SVar13;
  ShaderStage SVar14;
  ShaderStage SVar15;
  int extraout_EAX;
  TestNode *pTVar16;
  char *pcVar17;
  long *plVar18;
  UniformLocationCase *pUVar19;
  StructType *pSVar20;
  undefined4 extraout_var;
  string *psVar21;
  TestNode *pTVar22;
  TestContext *pTVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  long lVar25;
  ulong uVar26;
  DataType DVar27;
  int iVar28;
  iterator iVar29;
  ShaderStage SVar30;
  long lVar31;
  bool bVar32;
  int iVar33;
  int iVar34;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config;
  string name;
  Random rng;
  Random rng_1;
  UniformInfo uniform;
  Random rng_2;
  undefined1 local_388 [24];
  StructType *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  UniformLocationTests *local_348;
  ulong local_340;
  UniformLocationCase *local_338;
  TestNode *local_330;
  undefined8 local_328;
  TestNode *local_320;
  undefined1 local_318 [2] [16];
  StructType *local_2f8 [3];
  ulong local_2e0;
  vector<glu::StructType*,std::allocator<glu::StructType*>> *local_2d8;
  TestNode *local_2d0;
  ShaderStage local_2c8;
  ShaderStage local_2c4;
  ShaderStage local_2c0;
  ShaderStage local_2bc;
  ShaderStage local_2b8;
  ShaderStage local_2b4;
  undefined1 local_2b0 [24];
  undefined8 uStack_298;
  ShaderStage local_290;
  uint local_28c;
  ios_base local_240 [264];
  TestNode *local_138;
  VarType local_130;
  VarType local_118;
  VarType local_100;
  VarType local_e8;
  VarType local_d0;
  VarType local_b8;
  VarType local_a0;
  VarType local_88;
  VarType local_70;
  deRandom local_58;
  VarType local_48;
  
  uVar9 = tcu::CommandLine::getBaseSeed
                    (((this->super_TestCaseGroup).m_context)->m_testCtx->m_cmdLine);
  pTVar16 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar16,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Location specified with use, single shader stage");
  local_2e0 = (ulong)uVar9;
  deRandom_init((deRandom *)local_318,uVar9 + 0x1001);
  local_348 = this;
  tcu::TestNode::addChild((TestNode *)this,pTVar16);
  lVar25 = 0;
  do {
    local_338 = (UniformLocationCase *)(ulong)(uint)(&DAT_0097b700)[lVar25];
    local_328 = CONCAT44(local_328._4_4_,((&DAT_0097b700)[lVar25] - 0x23 < 4) + 2);
    local_340 = CONCAT44(local_340._4_4_,1);
    lVar31 = 0;
    local_330 = (TestNode *)lVar25;
    do {
      DVar27 = (DataType)local_338;
      pcVar17 = glu::getDataTypeName(DVar27);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,pcVar17,(allocator<char> *)local_2f8);
      plVar18 = (long *)std::__cxx11::string::append(local_388);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pTVar23 = (TestContext *)(plVar18 + 2);
      if ((TestContext *)*plVar18 == pTVar23) {
        local_2b0._16_8_ = pTVar23->m_platform;
        uStack_298 = plVar18[3];
      }
      else {
        local_2b0._16_8_ = pTVar23->m_platform;
        local_2b0._0_8_ = (TestContext *)*plVar18;
      }
      local_2b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar18 + 1);
      *plVar18 = (long)pTVar23;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      plVar18 = (long *)std::__cxx11::string::append((char *)local_2b0);
      local_368._M_allocated_capacity = (size_type)&local_358;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar18 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar18 == paVar24) {
        local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_358._8_8_ = plVar18[3];
      }
      else {
        local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_368._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar18;
      }
      local_368._8_8_ = plVar18[1];
      *plVar18 = (long)paVar24;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      local_388._0_16_ = (undefined1  [16])0x0;
      local_388._16_8_ = (StructType *)0x0;
      glu::VarType::VarType(&local_48,DVar27,(Precision)local_328);
      SVar12 = (&DAT_0097be08)[lVar31];
      dVar10 = deRandom_getUint32((deRandom *)local_318);
      glu::VarType::VarType((VarType *)local_2b0,&local_48);
      local_28c = dVar10 & 0x3ff;
      uStack_298 = CONCAT44(SVar12,SVar12);
      local_290 = SVar12;
      glu::VarType::~VarType(&local_48);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_388,(value_type *)local_2b0);
      pUVar19 = (UniformLocationCase *)operator_new(0x90);
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar19,(local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                         m_testCtx,((local_348->super_TestCaseGroup).m_context)->m_renderCtx,
                 (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_388);
      tcu::TestNode::addChild(pTVar16,(TestNode *)pUVar19);
      glu::VarType::~VarType((VarType *)local_2b0);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,local_358._M_allocated_capacity + 1)
        ;
      }
      lVar31 = 1;
      uVar26 = local_340 & 1;
      local_340 = local_340 & 0xffffffff00000000;
    } while (uVar26 != 0);
    lVar25 = (long)local_330 + 1;
  } while (lVar25 != 0x1c);
  pTVar16 = (TestNode *)operator_new(0x70);
  pUVar8 = local_348;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar16,
             (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"array",
             "Array location specified with use, single shader stage");
  deRandom_init((deRandom *)local_2f8,(int)local_2e0 + 0x2001);
  local_330 = pTVar16;
  tcu::TestNode::addChild((TestNode *)pUVar8,pTVar16);
  lVar25 = 0;
  do {
    local_338 = (UniformLocationCase *)(ulong)(uint)(&DAT_0097b700)[lVar25];
    local_328 = CONCAT44(local_328._4_4_,((&DAT_0097b700)[lVar25] - 0x23 < 4) + 2);
    local_340 = CONCAT44(local_340._4_4_,1);
    lVar31 = 0;
    local_320 = (TestNode *)lVar25;
    do {
      DVar27 = (DataType)local_338;
      pcVar17 = glu::getDataTypeName(DVar27);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,pcVar17,(allocator<char> *)local_318);
      plVar18 = (long *)std::__cxx11::string::append(local_388);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pTVar23 = (TestContext *)(plVar18 + 2);
      if ((TestContext *)*plVar18 == pTVar23) {
        local_2b0._16_8_ = pTVar23->m_platform;
        uStack_298 = plVar18[3];
      }
      else {
        local_2b0._16_8_ = pTVar23->m_platform;
        local_2b0._0_8_ = (TestContext *)*plVar18;
      }
      local_2b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar18 + 1);
      *plVar18 = (long)pTVar23;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      plVar18 = (long *)std::__cxx11::string::append((char *)local_2b0);
      local_368._M_allocated_capacity = (size_type)&local_358;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar18 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar18 == paVar24) {
        local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_358._8_8_ = plVar18[3];
      }
      else {
        local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_368._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar18;
      }
      local_368._8_8_ = plVar18[1];
      *plVar18 = (long)paVar24;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      local_388._0_16_ = (undefined1  [16])0x0;
      local_388._16_8_ = (StructType *)0x0;
      glu::VarType::VarType((VarType *)local_318,DVar27,(Precision)local_328);
      glu::VarType::VarType(&local_70,(VarType *)local_318,8);
      SVar12 = (&DAT_0097be08)[lVar31];
      dVar10 = deRandom_getUint32((deRandom *)local_2f8);
      glu::VarType::VarType((VarType *)local_2b0,&local_70);
      local_28c = dVar10 % 0x3f8;
      uStack_298 = CONCAT44(SVar12,SVar12);
      local_290 = SVar12;
      glu::VarType::~VarType(&local_70);
      glu::VarType::~VarType((VarType *)local_318);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_388,(value_type *)local_2b0);
      pTVar16 = local_330;
      pUVar19 = (UniformLocationCase *)operator_new(0x90);
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar19,(local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                         m_testCtx,((local_348->super_TestCaseGroup).m_context)->m_renderCtx,
                 (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_388);
      tcu::TestNode::addChild(pTVar16,(TestNode *)pUVar19);
      glu::VarType::~VarType((VarType *)local_2b0);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,local_358._M_allocated_capacity + 1)
        ;
      }
      lVar31 = 1;
      uVar26 = local_340 & 1;
      local_340 = local_340 & 0xffffffff00000000;
    } while (uVar26 != 0);
    lVar25 = (long)local_320 + 1;
  } while (lVar25 != 0x1c);
  pTVar16 = (TestNode *)operator_new(0x70);
  pUVar8 = local_348;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar16,
             (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "nested_array","Array location specified with use, single shader stage");
  deRandom_init(&local_58,(int)local_2e0 + 0x3001);
  tcu::TestNode::addChild((TestNode *)pUVar8,pTVar16);
  uVar26 = 0;
  local_320 = pTVar16;
  do {
    uVar9 = (&DAT_0097b700)[uVar26];
    local_340 = (ulong)uVar9;
    local_338 = (UniformLocationCase *)CONCAT44(local_338._4_4_,uVar9 - 0x27);
    local_330 = (TestNode *)CONCAT44(local_330._4_4_,(uVar9 - 0x23 < 4) + 2);
    local_328 = CONCAT44(local_328._4_4_,1);
    lVar25 = 0;
    local_2d0 = (TestNode *)uVar26;
    do {
      pcVar17 = glu::getDataTypeName((DataType)local_340);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,pcVar17,(allocator<char> *)local_318);
      plVar18 = (long *)std::__cxx11::string::append(local_388);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pTVar23 = (TestContext *)(plVar18 + 2);
      if ((TestContext *)*plVar18 == pTVar23) {
        local_2b0._16_8_ = pTVar23->m_platform;
        uStack_298 = plVar18[3];
      }
      else {
        local_2b0._16_8_ = pTVar23->m_platform;
        local_2b0._0_8_ = (TestContext *)*plVar18;
      }
      local_2b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar18 + 1);
      *plVar18 = (long)pTVar23;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      plVar18 = (long *)std::__cxx11::string::append(local_2b0);
      local_368._M_allocated_capacity = (size_type)&local_358;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar18 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar18 == paVar24) {
        local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_358._8_8_ = plVar18[3];
      }
      else {
        local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_368._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar18;
      }
      local_368._8_8_ = plVar18[1];
      *plVar18 = (long)paVar24;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      DVar27 = (DataType)local_340;
      iVar11 = glu::getDataTypeScalarSize(DVar27);
      bVar32 = 0x1d < (ShaderStage)local_338;
      local_388._0_16_ = (undefined1  [16])0x0;
      local_388._16_8_ = (StructType *)0x0;
      glu::VarType::VarType((VarType *)local_2f8,DVar27,(Precision)local_330);
      iVar28 = (uint)(iVar11 < 5 && bVar32) * 4 + 3;
      glu::VarType::VarType((VarType *)local_318,(VarType *)local_2f8,iVar28);
      glu::VarType::VarType(&local_88,(VarType *)local_318,iVar28);
      SVar12 = (&DAT_0097be08)[lVar25];
      dVar10 = deRandom_getUint32(&local_58);
      glu::VarType::VarType((VarType *)local_2b0,&local_88);
      local_28c = 0x3cf;
      if (iVar11 >= 5 || !bVar32) {
        local_28c = 0x3f7;
      }
      local_28c = dVar10 % local_28c;
      uStack_298 = CONCAT44(SVar12,SVar12);
      local_290 = SVar12;
      glu::VarType::~VarType(&local_88);
      glu::VarType::~VarType((VarType *)local_318);
      glu::VarType::~VarType((VarType *)local_2f8);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_388,(value_type *)local_2b0);
      pTVar16 = local_320;
      pUVar19 = (UniformLocationCase *)operator_new(0x90);
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar19,(local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                         m_testCtx,((local_348->super_TestCaseGroup).m_context)->m_renderCtx,
                 (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_388);
      tcu::TestNode::addChild(pTVar16,(TestNode *)pUVar19);
      glu::VarType::~VarType((VarType *)local_2b0);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,local_358._M_allocated_capacity + 1)
        ;
      }
      lVar25 = 1;
      uVar26 = local_328 & 1;
      local_328 = local_328 & 0xffffffff00000000;
    } while (uVar26 != 0);
    uVar26 = (long)local_2d0 + 1;
  } while (uVar26 != 0x1c);
  pUVar19 = (UniformLocationCase *)operator_new(0x70);
  pUVar8 = local_348;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pUVar19,
             (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"struct",
             "Struct location, random contents & declaration location");
  deRandom_init((deRandom *)local_318,(int)local_2e0 + 0x4001);
  local_338 = pUVar19;
  tcu::TestNode::addChild((TestNode *)pUVar8,(TestNode *)pUVar19);
  local_2d8 = (vector<glu::StructType*,std::allocator<glu::StructType*>> *)&pUVar8->structTypes;
  iVar11 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
    std::ostream::operator<<((value_type *)local_2b0,iVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
    std::ios_base::~ios_base(local_240);
    plVar18 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0x941093);
    local_368._M_allocated_capacity = (size_type)&local_358;
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar24) {
      local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_358._8_8_ = plVar18[3];
    }
    else {
      local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_368._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_368._8_8_ = plVar18[1];
    *plVar18 = (long)paVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,
                      (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
    }
    dVar10 = deRandom_getUint32((deRandom *)local_318);
    local_340 = CONCAT44(local_340._4_4_,dVar10);
    SVar12 = deRandom_getUint32((deRandom *)local_318);
    SVar13 = deRandom_getUint32((deRandom *)local_318);
    local_328 = CONCAT44(local_328._4_4_,(ShaderStage)local_340) & 0xffffffff00000003;
    if ((local_340 & 3) == 0) {
      uVar9 = 0xffffffff;
    }
    else {
      dVar10 = deRandom_getUint32((deRandom *)local_318);
      uVar9 = dVar10 % 0x3fb;
    }
    pSVar20 = (StructType *)operator_new(0x38);
    (pSVar20->m_typeName)._M_dataplus._M_p = (pointer)&(pSVar20->m_typeName).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)pSVar20,"S","");
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar29._M_current =
         (local_348->structTypes).
         super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_2f8[0] = pSVar20;
    if (iVar29._M_current ==
        (local_348->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar29,local_2f8);
    }
    else {
      *iVar29._M_current = pSVar20;
      pppSVar1 = &(local_348->structTypes).
                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    pSVar20 = local_2f8[0];
    dVar10 = deRandom_getUint32((deRandom *)local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_2f8[0];
    dVar10 = deRandom_getUint32((deRandom *)local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"b",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_2f8[0];
    dVar10 = deRandom_getUint32((deRandom *)local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"c",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_2f8[0];
    dVar10 = deRandom_getUint32((deRandom *)local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"d",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_2f8[0];
    dVar10 = deRandom_getUint32((deRandom *)local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"e",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    local_388._0_16_ = (undefined1  [16])0x0;
    local_388._16_8_ = (StructType *)0x0;
    glu::VarType::VarType(&local_a0,local_2f8[0]);
    glu::VarType::VarType((VarType *)local_2b0,&local_a0);
    local_290 = SVar13 & (SVar12 | (ShaderStage)local_340) & SHADERSTAGE_BOTH;
    uStack_298 = CONCAT44((Precision)local_328,SVar12 | (ShaderStage)local_340) & 0xffffffff00000003
    ;
    local_28c = uVar9;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_388,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_a0);
    pUVar19 = (UniformLocationCase *)operator_new(0x90);
    anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar19,(local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_348->super_TestCaseGroup).m_context)->m_renderCtx,
               (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)local_388);
    tcu::TestNode::addChild((TestNode *)local_338,(TestNode *)pUVar19);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_allocated_capacity != &local_358) {
      operator_delete((void *)local_368._M_allocated_capacity,local_358._M_allocated_capacity + 1);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 0x10);
  pTVar16 = (TestNode *)operator_new(0x70);
  pUVar8 = local_348;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar16,
             (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "nested_struct","Struct location specified with use, single shader stage");
  deRandom_init((deRandom *)local_2f8,(int)local_2e0 + 0x5001);
  local_138 = pTVar16;
  tcu::TestNode::addChild((TestNode *)pUVar8,pTVar16);
  local_328 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
    std::ostream::operator<<((value_type *)local_2b0,(int)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
    std::ios_base::~ios_base(local_240);
    plVar18 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0x941093);
    local_368._M_allocated_capacity = (size_type)&local_358;
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar24) {
      local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_358._8_8_ = plVar18[3];
    }
    else {
      local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_368._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_368._8_8_ = plVar18[1];
    *plVar18 = (long)paVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,
                      (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
    }
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    local_340 = CONCAT44(extraout_var,dVar10);
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    local_320 = (TestNode *)CONCAT44(local_320._4_4_,dVar10);
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    local_338 = (UniformLocationCase *)CONCAT44(local_338._4_4_,dVar10);
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    local_2d0 = (TestNode *)CONCAT44(local_2d0._4_4_,dVar10);
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    local_330 = (TestNode *)CONCAT44(local_330._4_4_,dVar10);
    local_2b4 = deRandom_getUint32((deRandom *)local_2f8);
    SVar12 = deRandom_getUint32((deRandom *)local_2f8);
    SVar13 = deRandom_getUint32((deRandom *)local_2f8);
    local_2b8 = deRandom_getUint32((deRandom *)local_2f8);
    local_2bc = deRandom_getUint32((deRandom *)local_2f8);
    local_2c0 = deRandom_getUint32((deRandom *)local_2f8);
    local_2c4 = deRandom_getUint32((deRandom *)local_2f8);
    SVar14 = deRandom_getUint32((deRandom *)local_2f8);
    psVar21 = (string *)operator_new(0x38);
    *(string **)psVar21 = psVar21 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar21,"Type0","");
    *(undefined1 (*) [16])(psVar21 + 0x20) = (undefined1  [16])0x0;
    *(undefined8 *)(psVar21 + 0x30) = 0;
    local_388._0_8_ = psVar21;
    psVar21 = (string *)operator_new(0x38);
    *(string **)psVar21 = psVar21 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar21,"Type1","");
    *(undefined1 (*) [16])(psVar21 + 0x20) = (undefined1  [16])0x0;
    *(undefined8 *)(psVar21 + 0x30) = 0;
    local_388._8_8_ = psVar21;
    pSVar20 = (StructType *)operator_new(0x38);
    (pSVar20->m_typeName)._M_dataplus._M_p = (pointer)&(pSVar20->m_typeName).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)pSVar20,"Type2","");
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388._16_8_ = pSVar20;
    pSVar20 = (StructType *)operator_new(0x38);
    (pSVar20->m_typeName)._M_dataplus._M_p = (pointer)&(pSVar20->m_typeName).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)pSVar20,"Type3","");
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar29._M_current =
         (local_348->structTypes).
         super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_370 = pSVar20;
    if (iVar29._M_current ==
        (local_348->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar29,(StructType **)local_388);
      iVar29._M_current =
           (local_348->structTypes).
           super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar29._M_current = (StructType *)local_388._0_8_;
      iVar29._M_current =
           (local_348->structTypes).
           super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (local_348->structTypes).
      super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar29._M_current;
    }
    if (iVar29._M_current ==
        (local_348->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar29,(StructType **)(local_388 + 8));
      iVar29._M_current =
           (local_348->structTypes).
           super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar29._M_current = (StructType *)local_388._8_8_;
      iVar29._M_current =
           (local_348->structTypes).
           super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (local_348->structTypes).
      super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar29._M_current;
    }
    if (iVar29._M_current ==
        (local_348->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar29,(StructType **)(local_388 + 0x10));
      iVar29._M_current =
           (local_348->structTypes).
           super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar29._M_current = (StructType *)local_388._16_8_;
      iVar29._M_current =
           (local_348->structTypes).
           super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (local_348->structTypes).
      super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar29._M_current;
    }
    if (iVar29._M_current ==
        (local_348->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar29,&local_370);
    }
    else {
      *iVar29._M_current = local_370;
      pppSVar1 = &(local_348->structTypes).
                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    uVar7 = local_388._0_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._0_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"b",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._0_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"c",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._0_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"d",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._0_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"e",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._8_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._8_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"b",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._8_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"c",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._8_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"d",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._8_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"e",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._16_8_;
    glu::VarType::VarType((VarType *)local_2b0,(StructType *)local_388._0_8_);
    glu::StructType::addMember((StructType *)uVar7,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._16_8_;
    glu::VarType::VarType((VarType *)local_2b0,(StructType *)local_388._8_8_);
    glu::StructType::addMember((StructType *)uVar7,"b",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar7 = local_388._16_8_;
    dVar10 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_0097b700)[dVar10 % 0x19],
               ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar7,"c",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_370;
    glu::VarType::VarType((VarType *)local_2b0,(StructType *)local_388._16_8_);
    glu::StructType::addMember(pSVar20,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    local_318[0]._0_4_ = 0;
    local_318[0]._4_4_ = 0;
    local_318[0]._8_4_ = 0;
    local_318[0]._12_4_ = 0;
    local_318[1]._0_8_ = 0;
    glu::VarType::VarType(&local_b8,(StructType *)local_388._0_8_);
    local_2c8 = SVar14;
    glu::VarType::VarType((VarType *)local_2b0,&local_b8);
    pTVar16 = local_2d0;
    local_28c = (int)local_340 + (int)((local_340 & 0xffffffff) / 0x3c4) * -0x3c4;
    local_340 = (ulong)local_28c;
    SVar12 = SVar12 | (ShaderStage)local_338;
    SVar14 = (ShaderStage)local_2d0;
    SVar15 = local_2b8 | (Precision)local_330;
    SVar13 = SVar13 | (ShaderStage)local_2d0 | SVar15;
    SVar30 = local_2b4 | (ShaderStage)local_320 | SVar12 | SVar13;
    local_290 = local_2bc & SVar30 & SHADERSTAGE_BOTH;
    local_28c = -(uint)(((ulong)local_320 & 3) == 0) | local_28c;
    uStack_298 = CONCAT44((ShaderStage)local_320,SVar30) & 0x300000003;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_318,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_b8);
    glu::VarType::VarType(&local_d0,(StructType *)local_388._8_8_);
    glu::VarType::VarType((VarType *)local_2b0,&local_d0);
    SVar12 = SVar12 | SVar13;
    local_290 = local_2c0 & SVar12 & SHADERSTAGE_BOTH;
    local_28c = -(uint)(((ulong)local_338 & 3) == 0) | (int)local_340 + 5U;
    uStack_298 = CONCAT44((ShaderStage)local_338,SVar12) & 0x300000003;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_318,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_d0);
    glu::VarType::VarType(&local_e8,(StructType *)local_388._16_8_);
    glu::VarType::VarType((VarType *)local_2b0,&local_e8);
    local_290 = local_2c4 & SVar13 & SHADERSTAGE_BOTH;
    local_28c = -(uint)(((ulong)pTVar16 & 3) == 0) | (int)local_340 + 0x10U;
    uStack_298 = CONCAT44(SVar14,SVar13) & 0x300000003;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_318,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_e8);
    glu::VarType::VarType(&local_100,local_370);
    glu::VarType::VarType((VarType *)local_2b0,&local_100);
    local_290 = local_2c8 & SVar15 & SHADERSTAGE_BOTH;
    local_28c = (int)local_340 + 0x1b;
    uVar26 = (ulong)local_28c;
    local_28c = -(uint)(((ulong)local_330 & 3) == 0) | local_28c;
    uStack_298 = CONCAT44((Precision)local_330,SVar15) & 0x300000003;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_318,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_100);
    pUVar19 = (UniformLocationCase *)operator_new(0x90);
    anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar19,(local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_348->super_TestCaseGroup).m_context)->m_renderCtx,
               (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)local_318);
    tcu::TestNode::addChild(local_138,(TestNode *)pUVar19);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_allocated_capacity != &local_358) {
      operator_delete((void *)local_368._M_allocated_capacity,local_358._M_allocated_capacity + 1);
    }
    uVar9 = (int)local_328 + 1;
    local_328 = (ulong)uVar9;
  } while (uVar9 != 0x10);
  pTVar16 = (TestNode *)operator_new(0x70);
  pUVar8 = local_348;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar16,
             (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_max"
             ,"Maximum & minimum location");
  tcu::TestNode::addChild((TestNode *)pUVar8,pTVar16);
  lVar25 = 0;
  do {
    local_340 = (ulong)(uint)(&DAT_0097b700)[lVar25];
    local_330 = (TestNode *)CONCAT44(local_330._4_4_,((&DAT_0097b700)[lVar25] - 0x23 < 4) + 2);
    uVar26 = CONCAT71((int7)(uVar26 >> 8),1);
    lVar31 = 0;
    local_320 = (TestNode *)lVar25;
    do {
      pcVar17 = glu::getDataTypeName((DataType)local_340);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,pcVar17,(allocator<char> *)local_318);
      plVar18 = (long *)std::__cxx11::string::append(local_388);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pTVar23 = (TestContext *)(plVar18 + 2);
      if ((TestContext *)*plVar18 == pTVar23) {
        local_2b0._16_8_ = pTVar23->m_platform;
        uStack_298 = plVar18[3];
      }
      else {
        local_2b0._16_8_ = pTVar23->m_platform;
        local_2b0._0_8_ = (TestContext *)*plVar18;
      }
      local_2b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar18 + 1);
      *plVar18 = (long)pTVar23;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      plVar18 = (long *)std::__cxx11::string::append((char *)local_2b0);
      local_368._M_allocated_capacity = (size_type)&local_358;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar18 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar18 == paVar24) {
        local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_358._8_8_ = plVar18[3];
      }
      else {
        local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_368._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar18;
      }
      local_368._8_8_ = plVar18[1];
      *plVar18 = (long)paVar24;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      local_328 = CONCAT44(local_328._4_4_,(int)uVar26);
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      local_318[0]._0_4_ = 0;
      local_318[0]._4_4_ = 0;
      local_318[0]._8_4_ = 0;
      local_318[0]._12_4_ = 0;
      local_318[1]._0_8_ = 0;
      glu::VarType::VarType(&local_118,(DataType)local_340,(Precision)local_330);
      SVar12 = (&DAT_0097be08)[lVar31];
      glu::VarType::VarType((VarType *)local_2b0,&local_118);
      uStack_298 = CONCAT44(SVar12,SVar12);
      local_28c = 0;
      local_290 = SVar12;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_318,(value_type *)local_2b0);
      glu::VarType::~VarType((VarType *)local_2b0);
      glu::VarType::~VarType(&local_118);
      pUVar19 = (UniformLocationCase *)operator_new(0x90);
      pTVar23 = (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar4 = ((local_348->super_TestCaseGroup).m_context)->m_renderCtx;
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b0,local_368._M_allocated_capacity,
                 local_368._8_8_ + local_368._M_allocated_capacity);
      std::__cxx11::string::append((char *)local_2b0);
      uVar7 = local_2b0._0_8_;
      local_388._0_8_ = local_388 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_368._M_allocated_capacity,
                 local_368._8_8_ + local_368._M_allocated_capacity);
      std::__cxx11::string::append(local_388);
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar19,pTVar23,pRVar4,(char *)uVar7,(char *)local_388._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_318);
      tcu::TestNode::addChild(pTVar16,(TestNode *)pUVar19);
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      local_338 = (UniformLocationCase *)operator_new(0x90);
      pTVar23 = (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar4 = ((local_348->super_TestCaseGroup).m_context)->m_renderCtx;
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b0,local_368._M_allocated_capacity,
                 local_368._8_8_ + local_368._M_allocated_capacity);
      std::__cxx11::string::append((char *)local_2b0);
      uVar7 = local_2b0._0_8_;
      local_388._0_8_ = local_388 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_368._M_allocated_capacity,
                 local_368._8_8_ + local_368._M_allocated_capacity);
      std::__cxx11::string::append(local_388);
      pUVar19 = local_338;
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (local_338,pTVar23,pRVar4,(char *)uVar7,(char *)local_388._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_318);
      (pUVar19->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__UniformLocationCase_00b337b8;
      tcu::TestNode::addChild(pTVar16,(TestNode *)pUVar19);
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_318);
      uVar6 = local_328;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,local_358._M_allocated_capacity + 1)
        ;
      }
      lVar31 = 1;
      uVar26 = 0;
    } while ((uVar6 & 1) != 0);
    lVar25 = (long)local_320 + 1;
  } while (lVar25 != 0x1c);
  pTVar16 = (TestNode *)operator_new(0x70);
  pUVar8 = local_348;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar16,
             (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"link",
             "Location specified independently from use");
  deRandom_init((deRandom *)local_318,(int)local_2e0 + 0x82e1);
  tcu::TestNode::addChild((TestNode *)pUVar8,pTVar16);
  local_320 = (TestNode *)0x0;
  local_2d0 = pTVar16;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
    std::ostream::operator<<((value_type *)local_2b0,(int)local_320);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
    std::ios_base::~ios_base(local_240);
    plVar18 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0x941093);
    local_368._M_allocated_capacity = (size_type)&local_358;
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar24) {
      local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_358._8_8_ = plVar18[3];
    }
    else {
      local_358._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_368._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_368._8_8_ = plVar18[1];
    *plVar18 = (long)paVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,
                      (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
    }
    local_388._0_16_ = (undefined1  [16])0x0;
    local_388._16_8_ = (StructType *)0x0;
    local_330 = (TestNode *)operator_new(0x1000);
    iVar11 = (ShaderStage)local_320 * 100;
    memset(local_330,0,0x1000);
    deRandom_init((deRandom *)local_2b0,iVar11 + 0x1234);
    lVar25 = 0;
    iVar11 = 0;
    iVar28 = 1;
    iVar33 = 2;
    iVar34 = 3;
    do {
      piVar2 = (int *)((long)&local_330->_vptr_TestNode + lVar25 * 4);
      *piVar2 = iVar11;
      piVar2[1] = iVar28;
      piVar2[2] = iVar33;
      piVar2[3] = iVar34;
      lVar25 = lVar25 + 4;
      iVar11 = iVar11 + 4;
      iVar28 = iVar28 + 4;
      iVar33 = iVar33 + 4;
      iVar34 = iVar34 + 4;
    } while (lVar25 != 0x400);
    uVar26 = 0x400;
    do {
      dVar10 = deRandom_getUint32((deRandom *)local_2b0);
      uVar6 = (ulong)dVar10 % (uVar26 & 0xffffffff);
      uVar3 = *(undefined4 *)((long)local_330 + uVar26 * 4 + -4);
      *(undefined4 *)((long)local_330 + uVar26 * 4 + -4) =
           *(undefined4 *)((long)&local_330->_vptr_TestNode + uVar6 * 4);
      *(undefined4 *)((long)&local_330->_vptr_TestNode + uVar6 * 4) = uVar3;
      uVar26 = uVar26 - 1;
    } while (1 < uVar26);
    local_338 = (UniformLocationCase *)((long)&local_330[0x24].m_description._M_string_length + 4);
    iVar11 = 0x20;
    do {
      local_340 = CONCAT44(local_340._4_4_,iVar11);
      SVar12 = deRandom_getUint32((deRandom *)local_318);
      SVar13 = deRandom_getUint32((deRandom *)local_318);
      SVar14 = deRandom_getUint32((deRandom *)local_318);
      dVar10 = deRandom_getUint32((deRandom *)local_318);
      glu::VarType::VarType
                (&local_130,(&DAT_0097b700)[dVar10 % 0x19],
                 ((&DAT_0097b700)[dVar10 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
      if ((SVar12 & SHADERSTAGE_BOTH) == SHADERSTAGE_NONE) {
        local_328 = CONCAT44(local_328._4_4_,0xffffffff);
      }
      else {
        local_328 = CONCAT44(local_328._4_4_,
                             *(undefined4 *)
                              &(local_338->super_TestCase).super_TestNode._vptr_TestNode);
      }
      glu::VarType::VarType((VarType *)local_2b0,&local_130);
      local_290 = SVar14 & (SVar13 | SVar12) & SHADERSTAGE_BOTH;
      uStack_298 = CONCAT44(SVar12,SVar13 | SVar12) & 0x300000003;
      local_28c = (Precision)local_328;
      glu::VarType::~VarType(&local_130);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_388,(value_type *)local_2b0);
      iVar11 = (ShaderStage)local_340;
      glu::VarType::~VarType((VarType *)local_2b0);
      local_338 = (UniformLocationCase *)
                  ((long)&local_338[-1].m_uniformInfo.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    pUVar19 = (UniformLocationCase *)operator_new(0x90);
    anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar19,(local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_348->super_TestCaseGroup).m_context)->m_renderCtx,
               (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)local_388);
    tcu::TestNode::addChild(local_2d0,(TestNode *)pUVar19);
    operator_delete(local_330,0x1000);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_allocated_capacity != &local_358) {
      operator_delete((void *)local_368._M_allocated_capacity,local_358._M_allocated_capacity + 1);
    }
    uVar9 = (int)local_320 + 1;
    local_320 = (TestNode *)(ulong)uVar9;
  } while (uVar9 != 10);
  pTVar16 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar16,
             (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "negative","Negative tests");
  pTVar22 = (TestNode *)operator_new(0x70);
  pUVar8 = local_348;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar22,
             (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es31",
             "GLSL ES 3.1 Negative tests");
  pCVar5 = (pUVar8->super_TestCaseGroup).m_context;
  gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)local_2b0,
             (pUVar8->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar5->m_renderCtx,pCVar5->m_contextInfo);
  gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_368,
             (ShaderLibrary *)local_2b0,"shaders/es31/uniform_location.test");
  if (0 < (int)((ulong)(local_368._8_8_ - local_368._0_8_) >> 3)) {
    lVar25 = 0;
    do {
      tcu::TestNode::addChild(pTVar22,*(TestNode **)(local_368._M_allocated_capacity + lVar25 * 8));
      lVar25 = lVar25 + 1;
    } while (lVar25 < (int)((ulong)(local_368._8_8_ - local_368._0_8_) >> 3));
  }
  tcu::TestNode::addChild(pTVar16,pTVar22);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_368._M_allocated_capacity,
                    local_358._M_allocated_capacity - local_368._0_8_);
  }
  gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)local_2b0);
  pTVar22 = (TestNode *)operator_new(0x70);
  pUVar8 = local_348;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar22,
             (local_348->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es32",
             "GLSL ES 3.2 Negative tests");
  pCVar5 = (pUVar8->super_TestCaseGroup).m_context;
  gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)local_2b0,
             (pUVar8->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar5->m_renderCtx,pCVar5->m_contextInfo);
  gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_368,
             (ShaderLibrary *)local_2b0,"shaders/es32/uniform_location.test");
  if (0 < (int)((ulong)(local_368._8_8_ - local_368._0_8_) >> 3)) {
    lVar25 = 0;
    do {
      tcu::TestNode::addChild(pTVar22,*(TestNode **)(local_368._M_allocated_capacity + lVar25 * 8));
      lVar25 = lVar25 + 1;
    } while (lVar25 < (int)((ulong)(local_368._8_8_ - local_368._0_8_) >> 3));
  }
  tcu::TestNode::addChild(pTVar16,pTVar22);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_368._M_allocated_capacity,
                    local_358._M_allocated_capacity - local_368._0_8_);
  }
  gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)local_2b0);
  tcu::TestNode::addChild((TestNode *)local_348,pTVar16);
  return extraout_EAX;
}

Assistant:

void UniformLocationTests::init (void)
{
	using namespace glu;

	const UniformInfo::ShaderStage checkStages[]	= { UniformInfo::SHADERSTAGE_VERTEX, UniformInfo::SHADERSTAGE_FRAGMENT };
	const char*						stageNames[]	= {"vertex", "fragment"};
	const int						maxLocations	= 1024;
	const int						baseSeed		= m_context.getTestContext().getCommandLine().getBaseSeed();

	const DataType					primitiveTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4,

		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4,

		TYPE_UINT,
		TYPE_UINT_VEC2,
		TYPE_UINT_VEC3,
		TYPE_UINT_VEC4,

		TYPE_BOOL,
		TYPE_BOOL_VEC2,
		TYPE_BOOL_VEC3,
		TYPE_BOOL_VEC4,

		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4,

		TYPE_SAMPLER_2D,
		TYPE_INT_SAMPLER_2D,
		TYPE_UINT_SAMPLER_2D,
	};

	const int maxPrimitiveTypeNdx = DE_LENGTH_OF_ARRAY(primitiveTypes) - 4;
	DE_ASSERT(primitiveTypes[maxPrimitiveTypeNdx] == TYPE_FLOAT_MAT4);

	// Primitive type cases with trivial linkage
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "basic", "Location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x1001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];

				vector<UniformInfo> config;

				UniformInfo			uniform	(createVarType(type),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 rng.getInt(0, maxLocations-1));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Arrays
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "array", "Array location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x2001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{

				const string		name	= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];

				vector<UniformInfo> config;

				UniformInfo			uniform	(VarType(createVarType(type), 8),
												checkStages[stageNdx],
												checkStages[stageNdx],
												checkStages[stageNdx],
												rng.getInt(0, maxLocations-1-8));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Nested Arrays
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "nested_array", "Array location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x3001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];
				// stay comfortably within minimum max uniform component count (896 in fragment) and sampler count with all types
				const int			arraySize	= (getDataTypeScalarSize(type) > 4 || isDataTypeSampler(type)) ? 3 : 7;

				vector<UniformInfo> config;

				UniformInfo			uniform	(VarType(VarType(createVarType(type), arraySize), arraySize),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 rng.getInt(0, maxLocations-1-arraySize*arraySize));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Structs
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "struct", "Struct location, random contents & declaration location");
		de::Random					rng		(baseSeed + 0x4001);
		addChild(group);

		for (int caseNdx = 0; caseNdx < 16; caseNdx++)
		{
			typedef UniformInfo::ShaderStage Stage;

			const string	name		= "case_" + de::toString(caseNdx);

			const Stage		layoutLoc	= Stage(rng.getUint32()&0x3);
			const Stage		declareLoc	= Stage((rng.getUint32()&0x3) | layoutLoc);
			const Stage		verifyLoc	= Stage((rng.getUint32()&0x3) & declareLoc);
			const int		location	= layoutLoc ? rng.getInt(0, maxLocations-1-5) : -1;

			StructType*		structProto = new StructType("S");

			structTypes.push_back(structProto);

			structProto->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			{
				vector<UniformInfo> config;

				config.push_back(UniformInfo(VarType(structProto),
											 declareLoc,
											 layoutLoc,
											 verifyLoc,
											 location));
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Nested Structs
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "nested_struct", "Struct location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x5001);

		addChild(group);

		for (int caseNdx = 0; caseNdx < 16; caseNdx++)
		{
			typedef UniformInfo::ShaderStage Stage;

			const string	name		= "case_" + de::toString(caseNdx);
			const int		baseLoc		= rng.getInt(0, maxLocations-1-60);

			// Structs need to be added in the order of their declaration
			const Stage		layoutLocs[]=
			{
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
			};

			const deUint32	tempDecl[] =
			{
				(rng.getUint32()&0x3) | layoutLocs[0],
				(rng.getUint32()&0x3) | layoutLocs[1],
				(rng.getUint32()&0x3) | layoutLocs[2],
				(rng.getUint32()&0x3) | layoutLocs[3],
			};

			// Component structs need to be declared if anything using them is declared
			const Stage		declareLocs[] =
			{
				Stage(tempDecl[0] | tempDecl[1] | tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[1] | tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[3]),
			};

			const Stage		verifyLocs[] =
			{
				Stage(rng.getUint32()&0x3 & declareLocs[0]),
				Stage(rng.getUint32()&0x3 & declareLocs[1]),
				Stage(rng.getUint32()&0x3 & declareLocs[2]),
				Stage(rng.getUint32()&0x3 & declareLocs[3]),
			};

			StructType*		testTypes[]	=
			{
				new StructType("Type0"),
				new StructType("Type1"),
				new StructType("Type2"),
				new StructType("Type3"),
			};

			structTypes.push_back(testTypes[0]);
			structTypes.push_back(testTypes[1]);
			structTypes.push_back(testTypes[2]);
			structTypes.push_back(testTypes[3]);

			testTypes[0]->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[1]->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[2]->addMember("a", VarType(testTypes[0]));
			testTypes[2]->addMember("b", VarType(testTypes[1]));
			testTypes[2]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[3]->addMember("a", VarType(testTypes[2]));

			{
				vector<UniformInfo> config;

				config.push_back(UniformInfo(VarType(testTypes[0]),
											 declareLocs[0],
											 layoutLocs[0],
											 verifyLocs[0],
											 layoutLocs[0] ? baseLoc : -1));

				config.push_back(UniformInfo(VarType(testTypes[1]),
											 declareLocs[1],
											 layoutLocs[1],
											 verifyLocs[1],
											 layoutLocs[1] ? baseLoc+5 : -1));

				config.push_back(UniformInfo(VarType(testTypes[2]),
											 declareLocs[2],
											 layoutLocs[2],
											 verifyLocs[2],
											 layoutLocs[2] ? baseLoc+16 : -1));

				config.push_back(UniformInfo(VarType(testTypes[3]),
											 declareLocs[3],
											 layoutLocs[3],
											 verifyLocs[3],
											 layoutLocs[3] ? baseLoc+27 : -1));

				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Min/Max location
	{
		tcu::TestCaseGroup* const	group		= new tcu::TestCaseGroup(m_testCtx, "min_max", "Maximum & minimum location");

		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];
				vector<UniformInfo> config;

				config.push_back(UniformInfo(createVarType(type),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 0));

				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), (name+"_min").c_str(), (name+"_min").c_str(), config));

				group->addChild(new MaxUniformLocationCase (m_testCtx, m_context.getRenderContext(), (name+"_max").c_str(), (name+"_max").c_str(), config));
			}
		}
	}

	// Link
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "link", "Location specified independently from use");
		de::Random					rng		(baseSeed + 0x82e1);

		addChild(group);

		for (int caseNdx = 0; caseNdx < 10; caseNdx++)
		{
			const string		name		= "case_" + de::toString(caseNdx);
			vector<UniformInfo> config;

			vector<int>			locations	= shuffledRange(0, maxLocations, 0x1234 + caseNdx*100);

			for (int count = 0; count < 32; count++)
			{
				typedef UniformInfo::ShaderStage Stage;

				const Stage			layoutLoc	= Stage(rng.getUint32()&0x3);
				const Stage			declareLoc	= Stage((rng.getUint32()&0x3) | layoutLoc);
				const Stage			verifyLoc	= Stage((rng.getUint32()&0x3) & declareLoc);

				const UniformInfo	uniform		(createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]),
												 declareLoc,
												 layoutLoc,
												 verifyLoc,
												 (layoutLoc!=0) ? locations.back() : -1);

				config.push_back(uniform);
				locations.pop_back();
			}
			group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
		}
	}

	// Negative
	{
		de::MovePtr<tcu::TestCaseGroup>	negativeGroup			(new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests"));

		{
			de::MovePtr<tcu::TestCaseGroup>	es31Group		(new tcu::TestCaseGroup(m_testCtx, "es31", "GLSL ES 3.1 Negative tests"));
			gls::ShaderLibrary				shaderLibrary   (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
			const vector<TestNode*>			negativeCases    = shaderLibrary.loadShaderFile("shaders/es31/uniform_location.test");

			for (int ndx = 0; ndx < int(negativeCases.size()); ndx++)
				es31Group->addChild(negativeCases[ndx]);

			negativeGroup->addChild(es31Group.release());
		}

		{
			de::MovePtr<tcu::TestCaseGroup>	es32Group		(new tcu::TestCaseGroup(m_testCtx, "es32", "GLSL ES 3.2 Negative tests"));
			gls::ShaderLibrary				shaderLibrary   (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
			const vector<TestNode*>			negativeCases    = shaderLibrary.loadShaderFile("shaders/es32/uniform_location.test");

			for (int ndx = 0; ndx < int(negativeCases.size()); ndx++)
				es32Group->addChild(negativeCases[ndx]);

			negativeGroup->addChild(es32Group.release());
		}

		addChild(negativeGroup.release());
	}
}